

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

QVariant * __thiscall
QWidgetTextControl::inputMethodQuery
          (QVariant *__return_storage_ptr__,QWidgetTextControl *this,InputMethodQuery property,
          QVariant argument)

{
  QWidgetTextControlPrivate *this_00;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CutResult CVar7;
  bool *in_RCX;
  int iVar8;
  long lVar9;
  QTextCursor *pQVar10;
  undefined1 *puVar11;
  QRectF *__return_storage_ptr___00;
  long in_FS_OFFSET;
  QArrayData *in_XMM1_Qa;
  QTextCursor tmpCursor;
  QArrayData *local_f8;
  QArrayData *pQStack_f0;
  QArrayData *local_e8;
  undefined1 *local_e0;
  QRectF local_d8;
  QRectF local_b8;
  long local_98 [2];
  undefined1 local_88 [32];
  QString local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  pQVar10 = &this_00->cursor;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::block();
  if ((int)property < 0x40) {
    if ((int)property < 8) {
      if (property == ImCursorRectangle) {
        __return_storage_ptr___00 = &local_b8;
        cursorRect(__return_storage_ptr___00,this,(QTextCursor *)(*(long *)(this + 8) + 0x88));
LAB_004c5d35:
        ::QVariant::QVariant(__return_storage_ptr__,*__return_storage_ptr___00);
        goto LAB_004c6344;
      }
      if (property == ImFont) {
        QTextCursor::charFormat();
        QTextCharFormat::font();
        QFont::operator_cast_to_QVariant(__return_storage_ptr__,(QFont *)local_88);
        QFont::~QFont((QFont *)local_88);
        QTextFormat::~QTextFormat((QTextFormat *)&local_68);
        goto LAB_004c6344;
      }
      goto LAB_004c5cff;
    }
    if (property != ImCursorPosition) {
      if (property == ImSurroundingText) {
        QTextBlock::text();
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_88);
      }
      else {
        if (property != ImCurrentSelection) goto LAB_004c5cff;
        QTextCursor::selectedText();
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_88);
      }
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      goto LAB_004c6344;
    }
    local_88._0_8_ = ::QVariant::toPointF();
    local_88._8_8_ = in_XMM1_Qa;
    if (((((double)local_88._0_8_ == 0.0) && (!NAN((double)local_88._0_8_))) &&
        ((double)in_XMM1_Qa == 0.0)) && (!NAN((double)in_XMM1_Qa))) {
      iVar2 = QTextCursor::position();
      goto LAB_004c5fdb;
    }
    cursorForPosition((QWidgetTextControl *)&local_68,(QPointF *)this);
    iVar6 = QTextCursor::position();
    iVar2 = QTextBlock::position();
    iVar6 = iVar6 - iVar2;
LAB_004c6139:
    pQVar10 = (QTextCursor *)&local_68;
    ::QVariant::QVariant(__return_storage_ptr__,iVar6);
  }
  else {
    if ((int)property < 0x800) {
      if (property == ImMaximumTextLength) {
LAB_004c5cff:
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      }
      else {
        if (property == ImAnchorPosition) {
          iVar2 = QTextCursor::anchor();
LAB_004c5fdb:
          iVar6 = QTextBlock::position();
          iVar2 = iVar2 - iVar6;
        }
        else {
          if (property != ImAbsolutePosition) goto LAB_004c5cff;
          local_88._0_8_ = ::QVariant::toPointF();
          local_88._8_8_ = in_XMM1_Qa;
          if ((((double)local_88._0_8_ != 0.0) || (NAN((double)local_88._0_8_))) ||
             (((double)in_XMM1_Qa != 0.0 || (NAN((double)in_XMM1_Qa))))) {
            cursorForPosition((QWidgetTextControl *)&local_68,(QPointF *)this);
            iVar6 = QTextCursor::position();
            goto LAB_004c6139;
          }
          iVar2 = QTextCursor::position();
        }
        ::QVariant::QVariant(__return_storage_ptr__,iVar2);
      }
      goto LAB_004c6344;
    }
    if (property == ImTextBeforeCursor) {
      iVar2 = 0x400;
      if (3 < *(ulong *)(in_RCX + 0x18)) {
        iVar2 = ::QVariant::toInt(in_RCX);
      }
      local_e0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_e0,pQVar10);
      iVar6 = QTextCursor::position();
      iVar3 = QTextBlock::position();
      iVar6 = iVar6 - iVar3;
      if (iVar6 < iVar2) {
        iVar8 = 0;
        iVar3 = iVar6;
        do {
          iVar4 = QTextCursor::blockNumber();
          QTextCursor::movePosition((MoveOperation)&local_e0,6,0);
          iVar5 = QTextCursor::blockNumber();
          if (iVar5 == iVar4) {
            local_68.d.d = (Data *)0x0;
            local_68.d.ptr = (char16_t *)0x0;
            local_68.d.size = 0;
            if (iVar8 == 0) goto LAB_004c626b;
            break;
          }
          QTextCursor::block();
          iVar4 = QTextBlock::length();
          iVar3 = iVar3 + iVar4;
          iVar8 = iVar8 + -1;
        } while (iVar3 < iVar2);
        local_68.d.size = 0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.d = (Data *)0x0;
        iVar8 = -iVar8;
        do {
          QTextCursor::block();
          QTextBlock::text();
          local_88._16_8_ = local_e8;
          local_88._8_8_ = pQStack_f0;
          local_88._0_8_ = local_f8;
          local_f8 = (QArrayData *)0x0;
          pQStack_f0 = (QArrayData *)0x0;
          local_e8 = (QArrayData *)0x0;
          local_88._24_2_ = 10;
          operator+=(&local_68,(QStringBuilder<QString,_char16_t> *)local_88);
          if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          if (local_f8 != (QArrayData *)0x0) {
            LOCK();
            (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f8,2,0x10);
            }
          }
          QTextCursor::movePosition((MoveOperation)&local_e0,0x10,0);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      else {
        local_68.d.d = (Data *)0x0;
        local_68.d.ptr = (char16_t *)0x0;
        local_68.d.size = 0;
      }
LAB_004c626b:
      QTextBlock::text();
      uVar1 = local_88._8_8_;
      local_98[0] = (long)iVar6;
      local_f8 = (QArrayData *)0x0;
      CVar7 = QtPrivate::QContainerImplHelper::mid(local_88._16_8_,(qsizetype *)&local_f8,local_98);
      lVar9 = 0;
      if (CVar7 != Null) {
        lVar9 = (long)&(((QBasicAtomicInt *)uVar1)->_q_value).super___atomic_base<int>._M_i +
                (long)local_f8 * 2;
      }
      QString::append((QChar *)&local_68,lVar9);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
    }
    else {
      if (property != ImTextAfterCursor) {
        if (property == ImAnchorRectangle) {
          iVar2 = QTextCursor::anchor();
          __return_storage_ptr___00 = &local_d8;
          QWidgetTextControlPrivate::rectForPosition(__return_storage_ptr___00,this_00,iVar2);
          goto LAB_004c5d35;
        }
        goto LAB_004c5cff;
      }
      puVar11 = (undefined1 *)0x400;
      if (3 < *(ulong *)(in_RCX + 0x18)) {
        iVar2 = ::QVariant::toInt(in_RCX);
        puVar11 = (undefined1 *)(long)iVar2;
      }
      local_e0 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_e0,pQVar10);
      QTextCursor::position();
      QTextBlock::position();
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::text();
      QString::mid((longlong)&local_68,(longlong)local_88);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      if (local_68.d.size < (long)puVar11) {
        do {
          iVar2 = QTextCursor::blockNumber();
          QTextCursor::movePosition((MoveOperation)&local_e0,0x10,0);
          iVar6 = QTextCursor::blockNumber();
          if (iVar6 == iVar2) break;
          QTextCursor::block();
          QTextBlock::text();
          local_88._24_8_ = local_e8;
          local_88._16_8_ = pQStack_f0;
          local_88._8_8_ = local_f8;
          local_88._0_2_ = 10;
          local_f8 = (QArrayData *)0x0;
          pQStack_f0 = (QArrayData *)0x0;
          local_e8 = (QArrayData *)0x0;
          operator+=(&local_68,(QStringBuilder<char16_t,_QString> *)local_88);
          if ((QArrayData *)local_88._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_88._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
            }
          }
          if (local_f8 != (QArrayData *)0x0) {
            LOCK();
            (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f8,2,0x10);
            }
          }
        } while ((ulong)local_68.d.size < puVar11);
      }
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar10 = (QTextCursor *)&local_e0;
  }
  QTextCursor::~QTextCursor(pQVar10);
LAB_004c6344:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QWidgetTextControl::inputMethodQuery(Qt::InputMethodQuery property, QVariant argument) const
{
    Q_D(const QWidgetTextControl);
    QTextBlock block = d->cursor.block();
    switch(property) {
    case Qt::ImCursorRectangle:
        return cursorRect();
    case Qt::ImAnchorRectangle:
        return d->rectForPosition(d->cursor.anchor());
    case Qt::ImFont:
        return QVariant(d->cursor.charFormat().font());
    case Qt::ImCursorPosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position() - block.position());
        return QVariant(d->cursor.position() - block.position()); }
    case Qt::ImSurroundingText:
        return QVariant(block.text());
    case Qt::ImCurrentSelection:
        return QVariant(d->cursor.selectedText());
    case Qt::ImMaximumTextLength:
        return QVariant(); // No limit.
    case Qt::ImAnchorPosition:
        return QVariant(d->cursor.anchor() - block.position());
    case Qt::ImAbsolutePosition: {
        const QPointF pt = argument.toPointF();
        if (!pt.isNull())
            return QVariant(cursorForPosition(pt).position());
        return QVariant(d->cursor.position()); }
    case Qt::ImTextAfterCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        QString result = block.text().mid(localPos);
        while (result.size() < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::NextBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            result += u'\n' + tmpCursor.block().text();
        }
        return QVariant(result);
    }
    case Qt::ImTextBeforeCursor:
    {
        int maxLength = argument.isValid() ? argument.toInt() : 1024;
        QTextCursor tmpCursor = d->cursor;
        int localPos = d->cursor.position() - block.position();
        int numBlocks = 0;
        int resultLen = localPos;
        while (resultLen < maxLength) {
            int currentBlock = tmpCursor.blockNumber();
            tmpCursor.movePosition(QTextCursor::PreviousBlock);
            if (tmpCursor.blockNumber() == currentBlock)
                break;
            numBlocks++;
            resultLen += tmpCursor.block().length();
        }
        QString result;
        while (numBlocks) {
            result += tmpCursor.block().text() + u'\n';
            tmpCursor.movePosition(QTextCursor::NextBlock);
            --numBlocks;
        }
        result += QStringView{block.text()}.mid(0, localPos);
        return QVariant(result);
    }
    default:
        return QVariant();
    }
}